

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandom.cpp
# Opt level: O1

uint32_t __thiscall jrtplib::RTPRandom::PickSeed(RTPRandom *this)

{
  __pid_t _Var1;
  time_t tVar2;
  clock_t cVar3;
  
  _Var1 = getpid();
  tVar2 = time((time_t *)0x0);
  cVar3 = clock();
  return (int)cVar3 + _Var1 + (int)tVar2 ^ (uint)this;
}

Assistant:

uint32_t RTPRandom::PickSeed()
{
	uint32_t x;
#if defined(WIN32) || defined(_WIN32_WINCE)
#ifndef _WIN32_WCE
	x = (uint32_t)_getpid();
	x += (uint32_t)time(0);
	x += (uint32_t)clock();
#else
	x = (uint32_t)GetCurrentProcessId();

	FILETIME ft;
	SYSTEMTIME st;
	
	GetSystemTime(&st);
	SystemTimeToFileTime(&st,&ft);
	
	x += ft.dwLowDateTime;
#endif // _WIN32_WCE
	x ^= (uint32_t)((uint8_t *)this - (uint8_t *)0);
#else
	x = (uint32_t)getpid();
	x += (uint32_t)time(0);
	x += (uint32_t)clock();
	x ^= (uint32_t)((uint8_t *)this - (uint8_t *)0);
#endif
	return x;
}